

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::InternReadFile_3DGS_MDL345(MDLImporter *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uchar *pcSrc;
  uchar *puVar6;
  DeadlyImportError *this_00;
  aiMesh *this_01;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  aiNode *this_02;
  uint *puVar10;
  aiMesh **ppaVar11;
  aiVector3D *paVar12;
  Logger *pLVar13;
  aiFace *paVar14;
  ulong uVar15;
  aiVector3t<float> *local_1b0;
  aiVector3t<float> *local_188;
  aiVector3t<float> *local_160;
  aiFace *local_130;
  aiVector3D *vec_1;
  uint local_e8;
  uint iIndex_1;
  uint c_1;
  uint iTemp_1;
  uint i_2;
  uint iCurrent_1;
  Vertex_MDL4 *pcVertices_1;
  SimpleFrame_MDLn_SP *pcFirstFrame_1;
  aiVector3D *vec;
  uint local_b8;
  uint iIndex;
  uint c;
  uint iTemp;
  uint i_1;
  uint iCurrent;
  Vertex *pcVertices;
  SimpleFrame *pcFirstFrame;
  Frame *pcFrames;
  aiMesh *pcMesh;
  Triangle_MDL3 *pcTriangles;
  TexCoord_MDL3 *pcTexCoords;
  uchar *puStack_70;
  uint iSkip;
  Skin *pcSkin;
  allocator local_51;
  string local_50;
  uint local_2c;
  uchar *puStack_28;
  uint i;
  uchar *szEnd;
  uchar *szCurrent;
  Header *pcHeader;
  MDLImporter *this_local;
  
  pcHeader = (Header *)this;
  if (this->pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x235,"void Assimp::MDLImporter::InternReadFile_3DGS_MDL345()");
  }
  szCurrent = this->mBuffer;
  ValidateHeader_Quake1(this,(Header *)szCurrent);
  szEnd = szCurrent + 0x54;
  puStack_28 = this->mBuffer + this->iFileSize;
  local_2c = 0;
  while( true ) {
    pcSrc = szEnd;
    if (*(uint *)(szCurrent + 0x30) <= local_2c) {
      pcMesh = (aiMesh *)(szEnd + (long)*(int *)(szCurrent + 0x48) * 4);
      szEnd = (uchar *)((long)pcMesh->mColors + (long)*(int *)(szCurrent + 0x40) * 0xc + -0x30);
      SizeCheck(this,szEnd,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x276);
      SetupMaterialProperties_3DGS_MDL5_Quake1(this);
      this_01 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_01);
      this_01->mPrimitiveTypes = 4;
      this_01->mNumVertices = *(int *)(szCurrent + 0x40) * 3;
      this_01->mNumFaces = *(uint *)(szCurrent + 0x40);
      uVar7 = CONCAT44(0,this_01->mNumFaces);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      uVar8 = SUB168(auVar1 * ZEXT816(0x10),0);
      uVar15 = uVar8 + 8;
      if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar8) {
        uVar15 = 0xffffffffffffffff;
      }
      puVar9 = (ulong *)operator_new__(uVar15);
      *puVar9 = uVar7;
      paVar14 = (aiFace *)(puVar9 + 1);
      if (uVar7 != 0) {
        local_130 = paVar14;
        do {
          aiFace::aiFace(local_130);
          local_130 = local_130 + 1;
        } while (local_130 != paVar14 + uVar7);
      }
      this_01->mFaces = paVar14;
      this_02 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_02);
      this->pScene->mRootNode = this_02;
      this->pScene->mRootNode->mNumMeshes = 1;
      puVar10 = (uint *)operator_new__(4);
      this->pScene->mRootNode->mMeshes = puVar10;
      *this->pScene->mRootNode->mMeshes = 0;
      this->pScene->mNumMeshes = 1;
      ppaVar11 = (aiMesh **)operator_new__(8);
      this->pScene->mMeshes = ppaVar11;
      *this->pScene->mMeshes = this_01;
      this_01->mNumVertices = *(int *)(szCurrent + 0x40) * 3;
      uVar7 = CONCAT44(0,this_01->mNumVertices);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      uVar8 = SUB168(auVar2 * ZEXT816(0xc),0);
      if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      paVar12 = (aiVector3D *)operator_new__(uVar8);
      if (uVar7 != 0) {
        local_160 = paVar12;
        do {
          aiVector3t<float>::aiVector3t(local_160);
          local_160 = local_160 + 1;
        } while (local_160 != paVar12 + uVar7);
      }
      this_01->mVertices = paVar12;
      uVar7 = CONCAT44(0,this_01->mNumVertices);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar7;
      uVar8 = SUB168(auVar3 * ZEXT816(0xc),0);
      if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      paVar12 = (aiVector3D *)operator_new__(uVar8);
      if (uVar7 != 0) {
        local_188 = paVar12;
        do {
          aiVector3t<float>::aiVector3t(local_188);
          local_188 = local_188 + 1;
        } while (local_188 != paVar12 + uVar7);
      }
      this_01->mNormals = paVar12;
      if (*(int *)(szCurrent + 0x48) != 0) {
        uVar7 = CONCAT44(0,this_01->mNumVertices);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar7;
        uVar8 = SUB168(auVar4 * ZEXT816(0xc),0);
        if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
          uVar8 = 0xffffffffffffffff;
        }
        paVar12 = (aiVector3D *)operator_new__(uVar8);
        if (uVar7 != 0) {
          local_1b0 = paVar12;
          do {
            aiVector3t<float>::aiVector3t(local_1b0);
            local_1b0 = local_1b0 + 1;
          } while (local_1b0 != paVar12 + uVar7);
        }
        this_01->mTextureCoords[0] = paVar12;
        this_01->mNumUVComponents[0] = 2;
      }
      puVar6 = szEnd;
      if ((*(int *)szEnd == 0) || (this->iGSFileVersion < 4)) {
        SizeCheck(this,szEnd + (long)*(int *)(szCurrent + 0x3c) * 4 + 0x1c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x2a2);
        iTemp = 0;
        for (c = 0; uVar5 = iTemp, c < *(uint *)(szCurrent + 0x40); c = c + 1) {
          puVar10 = (uint *)operator_new__(0xc);
          this_01->mFaces[c].mIndices = puVar10;
          this_01->mFaces[c].mNumIndices = 3;
          for (local_b8 = 0; local_b8 < 3; local_b8 = local_b8 + 1) {
            vec._4_4_ = (uint)*(ushort *)((long)pcMesh->mColors + (ulong)local_b8 * 2 + -0x30);
            if (*(uint *)(szCurrent + 0x3c) <= vec._4_4_) {
              vec._4_4_ = *(int *)(szCurrent + 0x3c) - 1;
              pLVar13 = DefaultLogger::get();
              Logger::warn(pLVar13,"Index overflow in MDLn vertex list");
            }
            paVar12 = this_01->mVertices + iTemp;
            paVar12->x = (float)puVar6[(ulong)vec._4_4_ * 4 + 0x1c] * *(float *)(szCurrent + 8);
            paVar12->x = paVar12->x + *(float *)(szCurrent + 0x14);
            paVar12->y = (float)puVar6[(ulong)vec._4_4_ * 4 + 0x1d] * *(float *)(szCurrent + 0xc);
            paVar12->y = paVar12->y + *(float *)(szCurrent + 0x18);
            paVar12->z = (float)puVar6[(ulong)vec._4_4_ * 4 + 0x1e] * *(float *)(szCurrent + 0x10);
            paVar12->z = *(float *)(szCurrent + 0x1c) + paVar12->z;
            MD2::LookupNormalIndex(puVar6[(ulong)vec._4_4_ * 4 + 0x1f],this_01->mNormals + iTemp);
            if (*(int *)(szCurrent + 0x48) != 0) {
              ImportUVCoordinate_3DGS_MDL345
                        (this,this_01->mTextureCoords[0] + iTemp,(TexCoord_MDL3 *)pcSrc,
                         (uint)*(ushort *)((long)pcMesh->mColors + (ulong)local_b8 * 2 + -0x2a));
            }
            iTemp = iTemp + 1;
          }
          *this_01->mFaces[c].mIndices = uVar5 + 2;
          this_01->mFaces[c].mIndices[1] = uVar5 + 1;
          this_01->mFaces[c].mIndices[2] = uVar5;
          pcMesh = (aiMesh *)&pcMesh->field_0xc;
        }
      }
      else {
        SizeCheck(this,szEnd + (long)*(int *)(szCurrent + 0x3c) * 8 + 0x24,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x2d9);
        iTemp_1 = 0;
        for (c_1 = 0; uVar5 = iTemp_1, c_1 < *(uint *)(szCurrent + 0x40); c_1 = c_1 + 1) {
          puVar10 = (uint *)operator_new__(0xc);
          this_01->mFaces[c_1].mIndices = puVar10;
          this_01->mFaces[c_1].mNumIndices = 3;
          for (local_e8 = 0; local_e8 < 3; local_e8 = local_e8 + 1) {
            vec_1._4_4_ = (uint)*(ushort *)((long)pcMesh->mColors + (ulong)local_e8 * 2 + -0x30);
            if (*(uint *)(szCurrent + 0x3c) <= vec_1._4_4_) {
              vec_1._4_4_ = *(int *)(szCurrent + 0x3c) - 1;
              pLVar13 = DefaultLogger::get();
              Logger::warn(pLVar13,"Index overflow in MDLn vertex list");
            }
            paVar12 = this_01->mVertices + iTemp_1;
            paVar12->x = (float)*(ushort *)(puVar6 + (ulong)vec_1._4_4_ * 8 + 0x24) *
                         *(float *)(szCurrent + 8);
            paVar12->x = paVar12->x + *(float *)(szCurrent + 0x14);
            paVar12->y = (float)*(ushort *)(puVar6 + (ulong)vec_1._4_4_ * 8 + 0x26) *
                         *(float *)(szCurrent + 0xc);
            paVar12->y = paVar12->y + *(float *)(szCurrent + 0x18);
            paVar12->z = (float)*(ushort *)(puVar6 + (ulong)vec_1._4_4_ * 8 + 0x28) *
                         *(float *)(szCurrent + 0x10);
            paVar12->z = *(float *)(szCurrent + 0x1c) + paVar12->z;
            MD2::LookupNormalIndex
                      (puVar6[(ulong)vec_1._4_4_ * 8 + 0x2a],this_01->mNormals + iTemp_1);
            if (*(int *)(szCurrent + 0x48) != 0) {
              ImportUVCoordinate_3DGS_MDL345
                        (this,this_01->mTextureCoords[0] + iTemp_1,(TexCoord_MDL3 *)pcSrc,
                         (uint)*(ushort *)((long)pcMesh->mColors + (ulong)local_e8 * 2 + -0x2a));
            }
            iTemp_1 = iTemp_1 + 1;
          }
          *this_01->mFaces[c_1].mIndices = uVar5 + 2;
          this_01->mFaces[c_1].mIndices[1] = uVar5 + 1;
          this_01->mFaces[c_1].mIndices[2] = uVar5;
          pcMesh = (aiMesh *)&pcMesh->field_0xc;
        }
      }
      if (this->iGSFileVersion == 5) {
        CalculateUVCoordinates_MDL5(this);
      }
      return;
    }
    if (puStack_28 <= szEnd) break;
    puStack_70 = szEnd;
    pcTexCoords._4_4_ = 0;
    if (local_2c != 0) {
      pcTexCoords._4_4_ = 0xffffffff;
    }
    if (this->iGSFileVersion < 5) {
      CreateTexture_3DGS_MDL4(this,szEnd + 4,*(uint *)szEnd,(uint *)((long)&pcTexCoords + 4));
    }
    else {
      CreateTexture_3DGS_MDL5(this,szEnd + 4,*(uint *)szEnd,(uint *)((long)&pcTexCoords + 4));
    }
    szEnd = szEnd + (ulong)pcTexCoords._4_4_ + 4;
    local_2c = local_2c + 1;
  }
  pcSkin._3_1_ = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Texture data past end of file.",&local_51);
  DeadlyImportError::DeadlyImportError(this_00,&local_50);
  pcSkin._3_1_ = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MDLImporter::InternReadFile_3DGS_MDL345( )
{
    ai_assert(NULL != pScene);

    // the header of MDL 3/4/5 is nearly identical to the original Quake1 header
    BE_NCONST MDL::Header *pcHeader = (BE_NCONST MDL::Header*)this->mBuffer;
#ifdef AI_BUILD_BIG_ENDIAN
    FlipQuakeHeader(pcHeader);
#endif
    ValidateHeader_Quake1(pcHeader);

    // current cursor position in the file
    const unsigned char* szCurrent = (const unsigned char*)(pcHeader+1);
    const unsigned char* szEnd = mBuffer + iFileSize;

    // need to read all textures
    for (unsigned int i = 0; i < (unsigned int)pcHeader->num_skins;++i) {
        if (szCurrent >= szEnd) {
            throw DeadlyImportError( "Texture data past end of file.");
        }
        BE_NCONST MDL::Skin* pcSkin;
        pcSkin = (BE_NCONST  MDL::Skin*)szCurrent;
        AI_SWAP4( pcSkin->group);
        // create one output image
        unsigned int iSkip = i ? UINT_MAX : 0;
        if (5 <= iGSFileVersion)
        {
            // MDL5 format could contain MIPmaps
            CreateTexture_3DGS_MDL5((unsigned char*)pcSkin + sizeof(uint32_t),
                pcSkin->group,&iSkip);
        }
        else    {
            CreateTexture_3DGS_MDL4((unsigned char*)pcSkin + sizeof(uint32_t),
                pcSkin->group,&iSkip);
        }
        // need to skip one image
        szCurrent += iSkip + sizeof(uint32_t);

    }
    // get a pointer to the texture coordinates
    BE_NCONST MDL::TexCoord_MDL3* pcTexCoords = (BE_NCONST MDL::TexCoord_MDL3*)szCurrent;
    szCurrent += sizeof(MDL::TexCoord_MDL3) * pcHeader->synctype;

    // NOTE: for MDLn formats "synctype" corresponds to the number of UV coords

    // get a pointer to the triangles
    BE_NCONST MDL::Triangle_MDL3* pcTriangles = (BE_NCONST MDL::Triangle_MDL3*)szCurrent;
    szCurrent += sizeof(MDL::Triangle_MDL3) * pcHeader->num_tris;

#ifdef AI_BUILD_BIG_ENDIAN

    for (int i = 0; i<pcHeader->synctype;++i)   {
        AI_SWAP2( pcTexCoords[i].u );
        AI_SWAP2( pcTexCoords[i].v );
    }

    for (int i = 0; i<pcHeader->num_tris;++i)   {
        AI_SWAP2( pcTriangles[i].index_xyz[0]);
        AI_SWAP2( pcTriangles[i].index_xyz[1]);
        AI_SWAP2( pcTriangles[i].index_xyz[2]);
        AI_SWAP2( pcTriangles[i].index_uv[0]);
        AI_SWAP2( pcTriangles[i].index_uv[1]);
        AI_SWAP2( pcTriangles[i].index_uv[2]);
    }

#endif

    VALIDATE_FILE_SIZE(szCurrent);

    // setup materials
    SetupMaterialProperties_3DGS_MDL5_Quake1();

    // allocate enough storage to hold all vertices and triangles
    aiMesh* pcMesh = new aiMesh();
    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    pcMesh->mNumVertices = pcHeader->num_tris * 3;
    pcMesh->mNumFaces = pcHeader->num_tris;
    pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

    // there won't be more than one mesh inside the file
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    pScene->mMeshes[0] = pcMesh;

    // allocate output storage
    pcMesh->mNumVertices = (unsigned int)pcHeader->num_tris*3;
    pcMesh->mVertices    = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mNormals     = new aiVector3D[pcMesh->mNumVertices];

    if (pcHeader->synctype) {
        pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mNumUVComponents[0] = 2;
    }

    // now get a pointer to the first frame in the file
    BE_NCONST MDL::Frame* pcFrames = (BE_NCONST MDL::Frame*)szCurrent;
    AI_SWAP4(pcFrames->type);

    // byte packed vertices
    // FIXME: these two snippets below are almost identical ... join them?
    /////////////////////////////////////////////////////////////////////////////////////
    if (0 == pcFrames->type || 3 >= this->iGSFileVersion)   {

        const MDL::SimpleFrame* pcFirstFrame = (const MDL::SimpleFrame*)(szCurrent + sizeof(uint32_t));
        const MDL::Vertex* pcVertices = (const MDL::Vertex*) ((pcFirstFrame->name) + sizeof(pcFirstFrame->name));

        VALIDATE_FILE_SIZE(pcVertices + pcHeader->num_verts);

        // now iterate through all triangles
        unsigned int iCurrent = 0;
        for (unsigned int i = 0; i < (unsigned int) pcHeader->num_tris;++i) {
            pcMesh->mFaces[i].mIndices = new unsigned int[3];
            pcMesh->mFaces[i].mNumIndices = 3;

            unsigned int iTemp = iCurrent;
            for (unsigned int c = 0; c < 3;++c,++iCurrent)  {
                // read vertices
                unsigned int iIndex = pcTriangles->index_xyz[c];
                if (iIndex >= (unsigned int)pcHeader->num_verts)    {
                    iIndex = pcHeader->num_verts-1;
                    ASSIMP_LOG_WARN("Index overflow in MDLn vertex list");
                }

                aiVector3D& vec = pcMesh->mVertices[iCurrent];
                vec.x = (float)pcVertices[iIndex].v[0] * pcHeader->scale[0];
                vec.x += pcHeader->translate[0];

                vec.y = (float)pcVertices[iIndex].v[1] * pcHeader->scale[1];
                vec.y += pcHeader->translate[1];
                // vec.y *= -1.0f;

                vec.z = (float)pcVertices[iIndex].v[2] * pcHeader->scale[2];
                vec.z += pcHeader->translate[2];

                // read the normal vector from the precalculated normal table
                MD2::LookupNormalIndex(pcVertices[iIndex].normalIndex,pcMesh->mNormals[iCurrent]);
                // pcMesh->mNormals[iCurrent].y *= -1.0f;

                // read texture coordinates
                if (pcHeader->synctype) {
                    ImportUVCoordinate_3DGS_MDL345(pcMesh->mTextureCoords[0][iCurrent],
                        pcTexCoords,pcTriangles->index_uv[c]);
                }
            }
            pcMesh->mFaces[i].mIndices[0] = iTemp+2;
            pcMesh->mFaces[i].mIndices[1] = iTemp+1;
            pcMesh->mFaces[i].mIndices[2] = iTemp+0;
            pcTriangles++;
        }

    }
    // short packed vertices
    /////////////////////////////////////////////////////////////////////////////////////
    else    {
        // now get a pointer to the first frame in the file
        const MDL::SimpleFrame_MDLn_SP* pcFirstFrame = (const MDL::SimpleFrame_MDLn_SP*) (szCurrent + sizeof(uint32_t));

        // get a pointer to the vertices
        const MDL::Vertex_MDL4* pcVertices = (const MDL::Vertex_MDL4*) ((pcFirstFrame->name) +
            sizeof(pcFirstFrame->name));

        VALIDATE_FILE_SIZE(pcVertices + pcHeader->num_verts);

        // now iterate through all triangles
        unsigned int iCurrent = 0;
        for (unsigned int i = 0; i < (unsigned int) pcHeader->num_tris;++i) {
            pcMesh->mFaces[i].mIndices = new unsigned int[3];
            pcMesh->mFaces[i].mNumIndices = 3;

            unsigned int iTemp = iCurrent;
            for (unsigned int c = 0; c < 3;++c,++iCurrent)  {
                // read vertices
                unsigned int iIndex = pcTriangles->index_xyz[c];
                if (iIndex >= (unsigned int)pcHeader->num_verts)    {
                    iIndex = pcHeader->num_verts-1;
                    ASSIMP_LOG_WARN("Index overflow in MDLn vertex list");
                }

                aiVector3D& vec = pcMesh->mVertices[iCurrent];
                vec.x = (float)pcVertices[iIndex].v[0] * pcHeader->scale[0];
                vec.x += pcHeader->translate[0];

                vec.y = (float)pcVertices[iIndex].v[1] * pcHeader->scale[1];
                vec.y += pcHeader->translate[1];
                // vec.y *= -1.0f;

                vec.z = (float)pcVertices[iIndex].v[2] * pcHeader->scale[2];
                vec.z += pcHeader->translate[2];

                // read the normal vector from the precalculated normal table
                MD2::LookupNormalIndex(pcVertices[iIndex].normalIndex,pcMesh->mNormals[iCurrent]);
                // pcMesh->mNormals[iCurrent].y *= -1.0f;

                // read texture coordinates
                if (pcHeader->synctype) {
                    ImportUVCoordinate_3DGS_MDL345(pcMesh->mTextureCoords[0][iCurrent],
                        pcTexCoords,pcTriangles->index_uv[c]);
                }
            }
            pcMesh->mFaces[i].mIndices[0] = iTemp+2;
            pcMesh->mFaces[i].mIndices[1] = iTemp+1;
            pcMesh->mFaces[i].mIndices[2] = iTemp+0;
            pcTriangles++;
        }
    }

    // For MDL5 we will need to build valid texture coordinates
    // basing upon the file loaded (only support one file as skin)
    if (0x5 == iGSFileVersion)
        CalculateUVCoordinates_MDL5();
    return;
}